

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseName.cpp
# Opt level: O2

int __thiscall DatabaseName::derive(DatabaseName *this,EVP_PKEY_CTX *ctx,uchar *key,size_t *keylen)

{
  string local_c0;
  string local_a0;
  string local_80;
  path local_60;
  
  std::experimental::filesystem::v1::__cxx11::path::path(&local_60,(path *)ctx);
  std::__cxx11::string::string((string *)&local_80,(string *)key);
  std::__cxx11::string::string((string *)&local_a0,(string *)(ctx + 0x60));
  std::__cxx11::string::string((string *)&local_c0,(string *)keylen);
  DatabaseName(this,&local_60,&local_80,&local_a0,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_60);
  return (int)this;
}

Assistant:

DatabaseName DatabaseName::derive(const std::string &new_type,
                                  const std::string &new_filename) const {
    return DatabaseName(db_base, new_type, id, new_filename);
}